

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeMemFromBtreeResize(BtCursor *pCur,u32 offset,u32 amt,Mem *pMem)

{
  int iVar1;
  
  pMem->flags = 1;
  if (pMem->szMalloc < (int)(amt + 2)) {
    iVar1 = sqlite3VdbeMemGrow(pMem,amt + 2,0);
  }
  else {
    pMem->z = pMem->zMalloc;
    pMem->flags = 1;
    iVar1 = 0;
  }
  if (iVar1 == 0) {
    iVar1 = accessPayload(pCur,offset,amt,(uchar *)pMem->z,0);
    if (iVar1 == 0) {
      pMem->z[amt] = '\0';
      pMem->z[amt + 1] = '\0';
      pMem->flags = 0x210;
      pMem->n = amt;
      iVar1 = 0;
    }
    else if (((pMem->flags & 0x2460) != 0) || (pMem->szMalloc != 0)) {
      vdbeMemClear(pMem);
    }
  }
  return iVar1;
}

Assistant:

static SQLITE_NOINLINE int vdbeMemFromBtreeResize(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  u32 offset,       /* Offset from the start of data to return bytes from. */
  u32 amt,          /* Number of bytes to return. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  int rc;
  pMem->flags = MEM_Null;
  if( SQLITE_OK==(rc = sqlite3VdbeMemClearAndResize(pMem, amt+2)) ){
    rc = sqlite3BtreePayload(pCur, offset, amt, pMem->z);
    if( rc==SQLITE_OK ){
      pMem->z[amt] = 0;
      pMem->z[amt+1] = 0;
      pMem->flags = MEM_Blob|MEM_Term;
      pMem->n = (int)amt;
    }else{
      sqlite3VdbeMemRelease(pMem);
    }
  }
  return rc;
}